

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t * opengv::relative_pose::seventeenpt(RelativeAdapterBase *adapter,Indices *indices)

{
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  double dVar4;
  double dVar5;
  long *plVar6;
  int iVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  Indices *in_RDX;
  long *in_RSI;
  transformation_t *in_RDI;
  Real RVar13;
  double dVar14;
  Scalar SVar15;
  ReturnType RVar16;
  ReturnType RVar17;
  double dVar18;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar137;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar138;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar139
  ;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar140
  ;
  VectorXd fitb;
  VectorXd fita;
  Vector3d tb;
  double temp_2;
  size_t i_4;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDb;
  Vector3d ta;
  MatrixXd PI;
  double temp_1;
  size_t i_3;
  MatrixXd SigmaInverse;
  double pinvtoler;
  VectorXd sigma;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDa;
  Vector3d temp2;
  Vector3d temp1;
  rotation_t R2_1;
  rotation_t R1_1;
  translation_t v2_1;
  translation_t v1_1;
  bearingVector_t d2_1;
  bearingVector_t d1_1;
  size_t i_2;
  VectorXd b_trb;
  VectorXd b_tra;
  MatrixXd A_trb;
  MatrixXd A_tra;
  rotation_t Rb;
  rotation_t Ra;
  Matrix3d W;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDR;
  essential_t E;
  MatrixXd E_temp;
  Matrix<double,_9,_1,_0,_9,_1> e;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDE;
  MatrixXd C;
  MatrixXd B;
  MatrixXd ARP;
  double temp;
  size_t i_1;
  MatrixXd SigmaInverse_;
  double pinvtoler_;
  VectorXd sigma_;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDARP;
  Matrix<double,_6,_1,_0,_6,_1> l2;
  Matrix<double,_6,_1,_0,_6,_1> l1;
  rotation_t R2;
  rotation_t R1;
  translation_t v2;
  translation_t v1;
  bearingVector_t d2;
  bearingVector_t d1;
  size_t i;
  MatrixXd AR;
  MatrixXd AE;
  size_t numberCorrespondences;
  transformation_t *transformation;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffda38;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *in_stack_ffffffffffffda40
  ;
  Indices *in_stack_ffffffffffffda48;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *in_stack_ffffffffffffda50;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffda58;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_ffffffffffffda60;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffda68;
  undefined8 in_stack_ffffffffffffda70;
  uint computationOptions;
  MatrixType *in_stack_ffffffffffffda78;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_ffffffffffffda80;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffdad0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffdad8;
  ulong local_1570;
  ulong local_12b0;
  undefined1 local_fa8 [72];
  undefined1 local_f60 [72];
  undefined1 local_f18 [24];
  undefined1 local_f00 [24];
  undefined1 local_ee8 [24];
  undefined1 local_ed0 [24];
  ulong local_eb8;
  undefined4 local_e8c;
  undefined4 local_e6c;
  non_const_type local_e30;
  non_const_type local_e28;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_e20;
  non_const_type local_db0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_da8;
  non_const_type local_aa8;
  undefined4 local_920;
  undefined4 local_91c;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_660;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_638;
  non_const_type local_5b0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_5a8;
  undefined4 local_57c;
  double local_560;
  ulong local_558;
  undefined4 local_538;
  undefined4 local_534;
  double local_518;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_188;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_178;
  undefined1 local_168 [72];
  undefined1 local_120 [72];
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  ulong local_78;
  undefined4 local_5c;
  undefined4 local_3c;
  size_t local_20;
  long *local_10;
  
  local_10 = in_RSI;
  local_20 = Indices::size(in_RDX);
  local_3c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (unsigned_long *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  local_5c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (unsigned_long *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  for (local_78 = 0; plVar6 = local_10, auVar28 = in_ZMM1._0_16_, local_78 < local_20;
      local_78 = local_78 + 1) {
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x10))(local_90,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x18))(local_a8,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x28))(local_c0,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x38))(local_d8,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x30))(local_120,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x40))(local_168,plVar6,(long)iVar7);
    PVar137 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffda38);
    local_178 = PVar137;
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffda38);
    PVar137 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffda38);
    local_188 = PVar137;
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffda38);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)0xb90538);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffda50,
               (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)in_stack_ffffffffffffda40
               ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_ffffffffffffdad8,in_stack_ffffffffffffdad0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffda50,
               (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)in_stack_ffffffffffffda40
               ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)0xb905d2);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffda50,
               (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)in_stack_ffffffffffffda40
               ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_ffffffffffffdad8,in_stack_ffffffffffffdad0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffda50,
               (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)in_stack_ffffffffffffda40
               ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb906e5);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9078c);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90833);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb908da);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90982);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90a2a);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90ad1);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90b79);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90c21);
    *pSVar9 = dVar14 * dVar18;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = SVar1;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = SVar2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar19,auVar59,auVar98);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90d3f);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = SVar1;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = SVar2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar20,auVar60,auVar99);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90e5f);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = SVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = SVar2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar21,auVar61,auVar100);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb90f7f);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = SVar1;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = SVar2;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar22,auVar62,auVar101);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9109f);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = SVar1;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = SVar2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar23,auVar63,auVar102);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb911c0);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = SVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = SVar2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar24,auVar64,auVar103);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb912e1);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = SVar1;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = SVar2;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar25,auVar65,auVar104);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91401);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = SVar1;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = SVar2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar26,auVar66,auVar105);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91522);
    *pSVar9 = auVar28._0_8_;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    SVar2 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = SVar1;
    in_ZMM1 = ZEXT1664(auVar67);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = SVar2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar14 * *pSVar8;
    auVar28 = vfmadd213sd_fma(auVar27,auVar67,auVar106);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91643);
    *pSVar9 = auVar28._0_8_;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda78,
             (uint)((ulong)in_stack_ffffffffffffda70 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (in_stack_ffffffffffffda40);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda40,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda38);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
  dVar14 = *pSVar10;
  auVar28 = vcvtusi2sd_avx512f(auVar28,local_20);
  RVar13 = Eigen::GenericNumTraits<double>::epsilon();
  local_518 = dVar14 * auVar28._0_8_ * RVar13;
  local_534 = 9;
  local_538 = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (int *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,in_stack_ffffffffffffda38);
  for (local_558 = 0; local_558 < 9; local_558 = local_558 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    local_560 = *pSVar10;
    if (local_518 < local_560) {
      dVar14 = 1.0 / local_560;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91865);
      *pSVar9 = dVar14;
    }
  }
  local_57c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (int *)in_stack_ffffffffffffda58,(unsigned_long *)in_stack_ffffffffffffda50);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  local_5a8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_ffffffffffffda40);
  local_5b0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)in_stack_ffffffffffffda50,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffda48);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffda38);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (unsigned_long *)in_stack_ffffffffffffda58,(unsigned_long *)in_stack_ffffffffffffda50);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((Index)in_stack_ffffffffffffda68,(Index)in_stack_ffffffffffffda60);
  Eigen::
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::operator-((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)in_stack_ffffffffffffda58);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)in_stack_ffffffffffffda38);
  local_638 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
            (in_stack_ffffffffffffda68,in_stack_ffffffffffffda60);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
              *)in_stack_ffffffffffffda38);
  local_660 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (&in_stack_ffffffffffffda40->m_matrixU,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_ffffffffffffda38);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda78,
             (uint)((ulong)in_stack_ffffffffffffda70 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48);
  Eigen::Matrix<double,9,1,0,9,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
            ((Matrix<double,_9,_1,_0,_9,_1> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
              *)in_stack_ffffffffffffda38);
  local_91c = 3;
  local_920 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (int *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_ffffffffffffda40,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_ffffffffffffda38);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_ffffffffffffda40,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_ffffffffffffda38);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda50,
             (Index)in_stack_ffffffffffffda48);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_ffffffffffffda40,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>_> *)
             in_stack_ffffffffffffda38);
  local_aa8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_ffffffffffffda38);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,3,3,0,3,3>>
            (&in_stack_ffffffffffffda40->m_matrixU,
             (EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda38);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda78,
             (uint)((ulong)in_stack_ffffffffffffda70 >> 0x20));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb91d34);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffda38);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91d70);
  *pSVar11 = -1.0;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91da5);
  *pSVar11 = 1.0;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb91dd9);
  *pSVar11 = 1.0;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_ffffffffffffda40);
  local_da8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  local_db0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)in_stack_ffffffffffffda50,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffda48);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_ffffffffffffda40);
  local_e28 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_ffffffffffffda38);
  local_e20 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda40,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  local_e30 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
  ::operator*(in_stack_ffffffffffffda50,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffda48);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffda38);
  SVar15 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xb91fd0);
  if (SVar15 < 0.0) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-(in_stack_ffffffffffffda58);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)in_stack_ffffffffffffda38);
  }
  SVar15 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xb920ee);
  auVar58 = ZEXT1664((undefined1  [16])0x0);
  if (SVar15 < 0.0) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-(in_stack_ffffffffffffda58);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)in_stack_ffffffffffffda38);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transposeInPlace
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xb92149);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transposeInPlace
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0xb92158);
  local_e6c = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (unsigned_long *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  local_e8c = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (unsigned_long *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda50,
             (unsigned_long *)in_stack_ffffffffffffda48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda50,
             (unsigned_long *)in_stack_ffffffffffffda48);
  for (local_eb8 = 0; plVar6 = local_10, auVar28 = auVar58._0_16_, local_eb8 < local_20;
      local_eb8 = local_eb8 + 1) {
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x10))(local_ed0,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x18))(local_ee8,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x28))(local_f00,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x38))(local_f18,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x30))(local_f60,plVar6,(long)iVar7);
    plVar6 = local_10;
    iVar7 = Indices::operator[](in_stack_ffffffffffffda48,
                                (int)((ulong)in_stack_ffffffffffffda40 >> 0x20));
    (**(code **)(*plVar6 + 0x40))(local_fa8,plVar6,(long)iVar7);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffda38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffda38);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9252a);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb925cd);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar14 * dVar18;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = SVar3;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar28,auVar68,auVar107);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92696);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar14 * dVar18;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = auVar28._0_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar29,auVar69,auVar108);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92750);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar14 * dVar18;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auVar28._0_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar30,auVar70,auVar109);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9280c);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar14 * dVar18;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auVar28._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar31,auVar71,auVar110);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb928c6);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar14 * dVar18;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auVar28._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar32,auVar72,auVar111);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92915);
    *pSVar9 = auVar28._0_8_;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb929b7);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92a5b);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar14 * dVar18;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = SVar3;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar33,auVar73,auVar112);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92b21);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar14 * dVar18;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auVar28._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar34,auVar74,auVar113);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92bd9);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar14 * dVar18;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = auVar28._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar35,auVar75,auVar114);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92c94);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar14 * dVar18;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = auVar28._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar36,auVar76,auVar115);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92d4f);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar14 * dVar18;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auVar28._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar37,auVar77,auVar116);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92d9f);
    *pSVar9 = auVar28._0_8_;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92e40);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92ee4);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar14 * dVar18;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = SVar3;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar38,auVar78,auVar117);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb92fac);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar14 * dVar18;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = auVar28._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar39,auVar79,auVar118);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93065);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar14 * dVar18;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auVar28._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar40,auVar80,auVar119);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9311e);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar14 * dVar18;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = auVar28._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar41,auVar81,auVar120);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb931d9);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar14 * dVar18;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auVar28._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar42,auVar82,auVar121);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93229);
    *pSVar9 = auVar28._0_8_;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb932cc);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9336f);
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar14 * dVar18;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = SVar3;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar43,auVar83,auVar122);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93438);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar14 * dVar18;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auVar28._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar44,auVar84,auVar123);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb934f2);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = dVar14 * dVar18;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = auVar28._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar45,auVar85,auVar124);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb935ae);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar14 * dVar18;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auVar28._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar46,auVar86,auVar125);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93668);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar14 * dVar18;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auVar28._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar47,auVar87,auVar126);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb936b7);
    *pSVar9 = auVar28._0_8_;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93759);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb937fd);
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar14 * dVar18;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = SVar3;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar48,auVar88,auVar127);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb938c3);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar14 * dVar18;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auVar28._0_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar49,auVar89,auVar128);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb9397b);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = dVar14 * dVar18;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auVar28._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar50,auVar90,auVar129);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93a36);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar14 * dVar18;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auVar28._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar51,auVar91,auVar130);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93af1);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar14 * dVar18;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auVar28._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar52,auVar92,auVar131);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93b41);
    *pSVar9 = auVar28._0_8_;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93be2);
    SVar3 = *pSVar11;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar4 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar5 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93c86);
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar14 * dVar18;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = SVar3;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = dVar4 * dVar5 * *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar53,auVar93,auVar132);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93d4e);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar14 * dVar18;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auVar28._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = *pSVar11;
    auVar28 = vfmadd213sd_fma(auVar54,auVar94,auVar133);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93e07);
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar14 * dVar18;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auVar28._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar55,auVar95,auVar134);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93ec0);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = dVar14 * dVar18;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auVar28._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar56,auVar96,auVar135);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar14 = *pSVar12;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar12;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93f7b);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar14 * dVar18;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auVar28._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = *pSVar11;
    auVar28 = vfnmadd213sd_fma(auVar57,auVar97,auVar136);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb93fcb);
    *pSVar9 = auVar28._0_8_;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_ffffffffffffdad8,in_stack_ffffffffffffdad0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_ffffffffffffdad8,in_stack_ffffffffffffdad0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    RVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffda40,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                         *)in_stack_ffffffffffffda38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    RVar17 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffda40,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                         *)in_stack_ffffffffffffda38);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    *pSVar10 = -RVar16 - RVar17;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    RVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffda40,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                         *)in_stack_ffffffffffffda38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffda40,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffda38);
    RVar17 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffda40,
                        (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                         *)in_stack_ffffffffffffda38);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    auVar58 = ZEXT864((ulong)(-RVar16 - RVar17));
    *pSVar10 = -RVar16 - RVar17;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda78,
             (uint)((ulong)in_stack_ffffffffffffda70 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (in_stack_ffffffffffffda40);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda40,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda38);
  auVar28 = vcvtusi2sd_avx512f(auVar28,local_20);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
  dVar14 = *pSVar10;
  RVar13 = Eigen::GenericNumTraits<double>::epsilon();
  dVar14 = auVar28._0_8_ * dVar14 * RVar13;
  auVar58 = ZEXT864((ulong)dVar14);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (int *)in_stack_ffffffffffffda58,(int *)in_stack_ffffffffffffda50);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,in_stack_ffffffffffffda38);
  for (local_12b0 = 0; computationOptions = (uint)((ulong)in_stack_ffffffffffffda70 >> 0x20),
      auVar28 = auVar58._0_16_, local_12b0 < 3; local_12b0 = local_12b0 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar10;
    if (dVar14 < dVar18) {
      dVar18 = 1.0 / dVar18;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb944ef);
      *pSVar9 = dVar18;
    }
    auVar58 = ZEXT864((ulong)dVar18);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffda60,
             (int *)in_stack_ffffffffffffda58,(unsigned_long *)in_stack_ffffffffffffda50);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda40,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)in_stack_ffffffffffffda50,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffda48);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffda38);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda40,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffda38);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)in_stack_ffffffffffffda38);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda78,computationOptions);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (in_stack_ffffffffffffda40);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda40,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda38);
  auVar28 = vcvtusi2sd_avx512f(auVar28,local_20);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
  dVar14 = *pSVar10;
  RVar13 = Eigen::GenericNumTraits<double>::epsilon();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffda48,(Index)in_stack_ffffffffffffda40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,in_stack_ffffffffffffda38);
  for (local_1570 = 0; local_1570 < 3; local_1570 = local_1570 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38);
    dVar18 = *pSVar10;
    if (auVar28._0_8_ * dVar14 * RVar13 < dVar18) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_ffffffffffffda40,(Index)in_stack_ffffffffffffda38,0xb94858);
      *pSVar9 = 1.0 / dVar18;
    }
  }
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_ffffffffffffda40);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda40,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda38);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (in_stack_ffffffffffffda40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)in_stack_ffffffffffffda50,
              (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
              in_stack_ffffffffffffda48);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_ffffffffffffda40->m_matrixU,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_ffffffffffffda38);
  PVar138 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffda40,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_ffffffffffffda38);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)in_stack_ffffffffffffda38);
  PVar139 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffda40,
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)PVar138.m_rhs,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar139.m_lhs)
  ;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_ffffffffffffda38);
  PVar140 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_ffffffffffffda40,
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       in_stack_ffffffffffffda38);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)PVar138.m_rhs,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar139.m_lhs)
  ;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffda40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_ffffffffffffda38);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0xb94ab2);
  this = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffda38
                   );
  other = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
          Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_ffffffffffffda38);
  if ((double)other <= (double)this) {
    Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar140.m_lhs,
               (Index)PVar140.m_rhs,(Index)this);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)this,other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar140.m_lhs,
               (Index)PVar140.m_rhs);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)this,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar140.m_lhs,
               (Index)PVar140.m_rhs,(Index)this);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)this,other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar140.m_lhs,
               (Index)PVar140.m_rhs);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)this,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94c15);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94c22);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94c3c);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94c49);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94c56);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94c70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94c7d);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94c8a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94c97);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94cb1);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94ccb);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94cd8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94ce5);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94cf2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0xb94cff);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94d19);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb94d26);
  return in_RDI;
}

Assistant:

transformation_t seventeenpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 16);

  Eigen::MatrixXd AE(numberCorrespondences,9);
  Eigen::MatrixXd AR(numberCorrespondences,9);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    bearingVector_t d1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t d2 = adapter.getBearingVector2(indices[i]);
    translation_t v1 = adapter.getCamOffset1(indices[i]);
    translation_t v2 = adapter.getCamOffset2(indices[i]);
    rotation_t R1 = adapter.getCamRotation1(indices[i]);
    rotation_t R2 = adapter.getCamRotation2(indices[i]);

    //unrotate the bearing-vectors to express everything in the body frame
    d1 = R1*d1;
    d2 = R2*d2;

    //generate the Plücker line coordinates
    Eigen::Matrix<double,6,1> l1;
    l1.block<3,1>(0,0) = d1;
    l1.block<3,1>(3,0) = v1.cross(d1);
    Eigen::Matrix<double,6,1> l2;
    l2.block<3,1>(0,0) = d2;
    l2.block<3,1>(3,0) = v2.cross(d2);

    //fill line of matrix A
    AE(i,0) = l2[0]*l1[0];
    AE(i,1) = l2[0]*l1[1];
    AE(i,2) = l2[0]*l1[2];
    AE(i,3) = l2[1]*l1[0];
    AE(i,4) = l2[1]*l1[1];
    AE(i,5) = l2[1]*l1[2];
    AE(i,6) = l2[2]*l1[0];
    AE(i,7) = l2[2]*l1[1];
    AE(i,8) = l2[2]*l1[2];

    AR(i,0) = l2[0]*l1[3]+l2[3]*l1[0];
    AR(i,1) = l2[0]*l1[4]+l2[3]*l1[1];
    AR(i,2) = l2[0]*l1[5]+l2[3]*l1[2];
    AR(i,3) = l2[1]*l1[3]+l2[4]*l1[0];
    AR(i,4) = l2[1]*l1[4]+l2[4]*l1[1];
    AR(i,5) = l2[1]*l1[5]+l2[4]*l1[2];
    AR(i,6) = l2[2]*l1[3]+l2[5]*l1[0];
    AR(i,7) = l2[2]*l1[4]+l2[5]*l1[1];
    AR(i,8) = l2[2]*l1[5]+l2[5]*l1[2];
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDARP(
      AR,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  Eigen::VectorXd sigma_ = SVDARP.singularValues();
  double pinvtoler_ =
      sigma_(0)*numberCorrespondences*NumTraits<double>::epsilon();
  Eigen::MatrixXd SigmaInverse_(9,9);
  SigmaInverse_ = Eigen::MatrixXd::Zero(9,9);
  for ( size_t i=0; i < 9; ++i)
  {
    double temp = sigma_(i);
    if( temp > pinvtoler_ )
      SigmaInverse_(i,i) = 1.0/temp;
  }
  
  Eigen::MatrixXd ARP(9,numberCorrespondences);
  ARP = SVDARP.matrixV()*SigmaInverse_*SVDARP.matrixU().transpose();

  Eigen::MatrixXd B(numberCorrespondences,numberCorrespondences);
  B = -Eigen::MatrixXd::Identity(numberCorrespondences,numberCorrespondences);
  B = B + AR*ARP;

  Eigen::MatrixXd C = B*AE;
  
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDE(
      C,
      Eigen::ComputeThinU | Eigen::ComputeThinV );
  Eigen::Matrix<double,9,1> e = SVDE.matrixV().col(8);

  Eigen::MatrixXd E_temp(3,3);
  E_temp.col(0) = e.block<3,1>(0,0);
  E_temp.col(1) = e.block<3,1>(3,0);
  E_temp.col(2) = e.block<3,1>(6,0);
  essential_t E = E_temp.transpose();

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDR(
      E,
      Eigen::ComputeFullV | Eigen::ComputeFullU );

  Eigen::Matrix3d W = Eigen::Matrix3d::Zero();
  W(0,1) = -1.0;
  W(1,0) = 1.0;
  W(2,2) = 1.0;

  // get possible rotation and translation vectors
  rotation_t Ra = SVDR.matrixU() * W * SVDR.matrixV().transpose();
  rotation_t Rb = SVDR.matrixU() * W.transpose() * SVDR.matrixV().transpose();

  // change sign if det = -1
  if( Ra.determinant() < 0 ) Ra = -Ra;
  if( Rb.determinant() < 0 ) Rb = -Rb;

  Ra.transposeInPlace();
  Rb.transposeInPlace();

  Eigen::MatrixXd A_tra(numberCorrespondences,3);
  Eigen::MatrixXd A_trb(numberCorrespondences,3);
  Eigen::VectorXd b_tra(numberCorrespondences);
  Eigen::VectorXd b_trb(numberCorrespondences);

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    bearingVector_t d1 = adapter.getBearingVector1(indices[i]);
    bearingVector_t d2 = adapter.getBearingVector2(indices[i]);
    translation_t v1 = adapter.getCamOffset1(indices[i]);
    translation_t v2 = adapter.getCamOffset2(indices[i]);
    rotation_t R1 = adapter.getCamRotation1(indices[i]);
    rotation_t R2 = adapter.getCamRotation2(indices[i]);

    //unrotate the bearing-vectors to express everything in the body frame
    d1 = R1*d1;
    d2 = R2*d2;

    A_tra(i,0) = d1[2]*d2[0]*Ra(1,0)+d1[2]*d2[1]*Ra(1,1)+d1[2]*d2[2]*Ra(1,2)
                -d1[1]*d2[0]*Ra(2,0)-d1[1]*d2[1]*Ra(2,1)-d1[1]*d2[2]*Ra(2,2);
    A_tra(i,1) = d1[0]*d2[0]*Ra(2,0)+d1[0]*d2[1]*Ra(2,1)+d1[0]*d2[2]*Ra(2,2)
                -d1[2]*d2[0]*Ra(0,0)-d1[2]*d2[1]*Ra(0,1)-d1[2]*d2[2]*Ra(0,2);
    A_tra(i,2) = d1[1]*d2[0]*Ra(0,0)+d1[1]*d2[1]*Ra(0,1)+d1[1]*d2[2]*Ra(0,2)
                -d1[0]*d2[0]*Ra(1,0)-d1[0]*d2[1]*Ra(1,1)-d1[0]*d2[2]*Ra(1,2);

    A_trb(i,0) = d1[2]*d2[0]*Rb(1,0)+d1[2]*d2[1]*Rb(1,1)+d1[2]*d2[2]*Rb(1,2)
                -d1[1]*d2[0]*Rb(2,0)-d1[1]*d2[1]*Rb(2,1)-d1[1]*d2[2]*Rb(2,2);
    A_trb(i,1) = d1[0]*d2[0]*Rb(2,0)+d1[0]*d2[1]*Rb(2,1)+d1[0]*d2[2]*Rb(2,2)
                -d1[2]*d2[0]*Rb(0,0)-d1[2]*d2[1]*Rb(0,1)-d1[2]*d2[2]*Rb(0,2);
    A_trb(i,2) = d1[1]*d2[0]*Rb(0,0)+d1[1]*d2[1]*Rb(0,1)+d1[1]*d2[2]*Rb(0,2)
                -d1[0]*d2[0]*Rb(1,0)-d1[0]*d2[1]*Rb(1,1)-d1[0]*d2[2]*Rb(1,2);

    Eigen::Vector3d temp1 = v1.cross(d1);
    Eigen::Vector3d temp2 = v2.cross(d2);
    b_tra(i) = -d1.dot(Ra*temp2) -temp1.dot(Ra*d2);
    b_trb(i) = -d1.dot(Rb*temp2) -temp1.dot(Rb*d2);
  }
  
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDa(
      A_tra,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  Eigen::VectorXd sigma = SVDa.singularValues();
  double pinvtoler =
      numberCorrespondences*sigma(0)*NumTraits<double>::epsilon();
  Eigen::MatrixXd SigmaInverse(3,3);
  SigmaInverse = Eigen::MatrixXd::Zero(3,3);
  for ( size_t i=0; i < 3; ++i)
  {
    double temp = sigma(i);
    if( temp > pinvtoler )
      SigmaInverse(i,i) = 1.0/temp;
  }

  Eigen::MatrixXd PI(3,numberCorrespondences);
  PI = SVDa.matrixV()*SigmaInverse*SVDa.matrixU().transpose();
  Eigen::Vector3d ta = PI*b_tra;

  Eigen::JacobiSVD< Eigen::MatrixXd > SVDb(
      A_trb,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  sigma = SVDb.singularValues();
  pinvtoler = numberCorrespondences*sigma(0)*NumTraits<double>::epsilon();
  SigmaInverse = Eigen::MatrixXd::Zero(3,3);
  for ( size_t i=0; i < 3; ++i)
  {
    double temp = sigma(i);
    if( temp > pinvtoler )
      SigmaInverse(i,i) = 1.0/temp;
  }

  PI = SVDb.matrixV()*SigmaInverse*SVDb.matrixU().transpose();
  Eigen::Vector3d tb = PI*b_trb;

  Eigen::VectorXd fita = A_tra * ta - b_tra;
  Eigen::VectorXd fitb = A_trb * tb - b_trb;

  transformation_t transformation;
  if( fita.norm() < fitb.norm() )
  {
    transformation.block<3,3>(0,0) = Ra;
    transformation.col(3) = ta;
  }
  else
  {
    transformation.block<3,3>(0,0) = Rb;
    transformation.col(3) = tb;
  }

  return transformation;
}